

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# image.c
# Opt level: O2

image_t * png_read(char *filename)

{
  FILE *__stream;
  image_t *piVar1;
  uchar *buffer;
  int *piVar2;
  char *pcVar3;
  char *pcVar4;
  char *__format;
  FILE *__stream_00;
  png_image png;
  
  png.opaque = (png_controlp)0x0;
  png.message[0x2c] = '\0';
  png.message[0x2d] = '\0';
  png.message[0x2e] = '\0';
  png.message[0x2f] = '\0';
  png.message[0x30] = '\0';
  png.message[0x31] = '\0';
  png.message[0x32] = '\0';
  png.message[0x33] = '\0';
  png.message[0x34] = '\0';
  png.message[0x35] = '\0';
  png.message[0x36] = '\0';
  png.message[0x37] = '\0';
  png.message[0x38] = '\0';
  png.message[0x39] = '\0';
  png.message[0x3a] = '\0';
  png.message[0x3b] = '\0';
  png.message[0x1c] = '\0';
  png.message[0x1d] = '\0';
  png.message[0x1e] = '\0';
  png.message[0x1f] = '\0';
  png.message[0x20] = '\0';
  png.message[0x21] = '\0';
  png.message[0x22] = '\0';
  png.message[0x23] = '\0';
  png.message[0x24] = '\0';
  png.message[0x25] = '\0';
  png.message[0x26] = '\0';
  png.message[0x27] = '\0';
  png.message[0x28] = '\0';
  png.message[0x29] = '\0';
  png.message[0x2a] = '\0';
  png.message[0x2b] = '\0';
  png.message[0xc] = '\0';
  png.message[0xd] = '\0';
  png.message[0xe] = '\0';
  png.message[0xf] = '\0';
  png.message[0x10] = '\0';
  png.message[0x11] = '\0';
  png.message[0x12] = '\0';
  png.message[0x13] = '\0';
  png.message[0x14] = '\0';
  png.message[0x15] = '\0';
  png.message[0x16] = '\0';
  png.message[0x17] = '\0';
  png.message[0x18] = '\0';
  png.message[0x19] = '\0';
  png.message[0x1a] = '\0';
  png.message[0x1b] = '\0';
  png.warning_or_error = 0;
  png.message[0] = '\0';
  png.message[1] = '\0';
  png.message[2] = '\0';
  png.message[3] = '\0';
  png.message[4] = '\0';
  png.message[5] = '\0';
  png.message[6] = '\0';
  png.message[7] = '\0';
  png.message[8] = '\0';
  png.message[9] = '\0';
  png.message[10] = '\0';
  png.message[0xb] = '\0';
  png.height = 0;
  png.format = 0;
  png.flags = 0;
  png.colormap_entries = 0;
  png.message[0x3c] = '\0';
  png.message[0x3d] = '\0';
  png.message[0x3e] = '\0';
  png.message[0x3f] = '\0';
  png._100_4_ = 0;
  png.version = 1;
  png.width = 0;
  __stream = fopen(filename,"rb");
  __stream_00 = _stderr;
  pcVar4 = argv0;
  if (__stream == (FILE *)0x0) {
    piVar2 = __errno_location();
    pcVar3 = strerror(*piVar2);
    __format = "%s: couldn\'t open %s for reading: %s\n";
  }
  else {
    png_image_begin_read_from_stdio(&png,(FILE *)__stream);
    if ((png._32_8_ & 2) == 0) {
      png.format = 3;
      piVar1 = (image_t *)malloc(0x18);
      piVar1->width = png.width;
      piVar1->height = png.height;
      piVar1->format = 0xffffffff;
      buffer = (uchar *)malloc((ulong)(png.width * png.height * 4));
      piVar1->data = buffer;
      png_image_finish_read(&png,(png_const_colorp)0x0,buffer,0,(void *)0x0);
      if ((png._32_8_ & 2) == 0) {
        fclose(__stream);
        return piVar1;
      }
    }
    pcVar3 = png.message;
    __format = "%s: error reading %s: %s\n";
    pcVar4 = argv0;
    __stream_00 = _stderr;
  }
  fprintf(__stream_00,__format,pcVar4,filename,pcVar3);
  exit(1);
}

Assistant:

image_t*
png_read(
    const char* filename)
{
    FILE* stream;
    image_t* image;
    png_image png = {
        .version = PNG_IMAGE_VERSION,
        .opaque = NULL
    };

    stream = fopen(filename, "rb");
    if(!stream) {
        fprintf(stderr, "%s: couldn't open %s for reading: %s\n",
            argv0, filename, strerror(errno));
        exit(1);
    }

#define ERR_WRAP(x) \
    x; \
    if(PNG_IMAGE_FAILED(png)) { \
        fprintf(stderr, "%s: error reading %s: %s\n", \
            argv0, filename, png.message); \
        exit(1); \
    }

    ERR_WRAP(png_image_begin_read_from_stdio(&png, stream));
    png.format = PNG_FORMAT_RGBA;

    image = malloc(sizeof(image_t));
    image->width = png.width;
    image->height = png.height;
    image->format = FORMAT_RGBA8888;
    image->data = malloc(PNG_IMAGE_SIZE(png));

    ERR_WRAP(png_image_finish_read(&png, 0, image->data, 0, NULL));
    fclose(stream);

#undef ERR_WRAP

    return image;
}